

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *pvVar1;
  cmMakefile *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  TargetType TVar5;
  cmComputeLinkInformation *pcli_00;
  string *psVar6;
  reference ppcVar7;
  char *pcVar8;
  ulong uVar9;
  bool local_57a;
  byte local_562;
  undefined1 local_4f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  undefined1 local_4d0 [8];
  string configLinkFlags_1;
  string local_4a8;
  char *local_488;
  char *targetLinkFlags_1;
  string cmp0065Flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  allocator<char> local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3f0 [8];
  string sFlagVar;
  string local_3c8;
  allocator<char> local_3a1;
  undefined1 local_3a0 [8];
  string exportFlagVar;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  undefined4 local_304;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator<char> local_2d9;
  undefined1 local_2d8 [8];
  string build_1;
  string local_2b0;
  undefined1 local_290 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  undefined1 local_270 [8];
  string configLinkFlags;
  string local_248;
  char *local_228;
  char *targetLinkFlags;
  string local_200;
  cmSourceFile *local_1e0;
  cmSourceFile *sf;
  iterator __end4;
  iterator __begin4;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range4;
  string local_1b8;
  string local_198 [8];
  string defFlag;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_158;
  byte local_133;
  byte local_132;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  undefined1 local_e0 [8];
  string build;
  string local_b8;
  undefined1 local_98 [8];
  string linkLanguage;
  char *libraryLinkVariable;
  cmComputeLinkInformation *pcli;
  string buildType;
  string *linkFlags_local;
  string *flags_local;
  string *linkLibs_local;
  string *config_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmLocalGenerator *this_local;
  
  buildType.field_2._8_8_ = linkFlags;
  cmsys::SystemTools::UpperCase((string *)&pcli,config);
  pcli_00 = cmGeneratorTarget::GetLinkInformation(target,config);
  linkLanguage.field_2._8_8_ = anon_var_dwarf_7b4eb;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(local_98,linkLineComputer,target,&pcli);
  TVar5 = cmGeneratorTarget::GetType(target);
  switch(TVar5) {
  case EXECUTABLE:
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"Swift");
    if (bVar4) {
      pcVar2 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"CMAKE_EXE_LINKER_FLAGS",
                 (allocator<char> *)(build_1.field_2._M_local_buf + 0xf));
      psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_2b0);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)(build_1.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2d8,"CMAKE_EXE_LINKER_FLAGS_",&local_2d9);
        std::allocator<char>::~allocator(&local_2d9);
        std::__cxx11::string::operator+=((string *)local_2d8,(string *)&pcli);
        psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_2d8);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)psVar6);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
        std::__cxx11::string::~string((string *)local_2d8);
      }
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) != 0) {
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        std::operator+(&local_300,"CMake can not determine linker language for target: ",psVar6);
        cmSystemTools::Error(&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        local_304 = 1;
        goto LAB_0018b8ed;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"WIN32_EXECUTABLE",&local_329);
      bVar4 = cmGeneratorTarget::GetPropertyAsBool(target,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      if (bVar4) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"CMAKE_CREATE_WIN32_EXE",&local_351);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_350);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator(&local_351);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      }
      else {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"CMAKE_CREATE_CONSOLE_EXE",
                   (allocator<char> *)(exportFlagVar.field_2._M_local_buf + 0xf));
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_378);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(exportFlagVar.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      }
      bVar4 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3a0,"CMAKE_EXE_EXPORTS_",&local_3a1);
        std::allocator<char>::~allocator(&local_3a1);
        std::__cxx11::string::operator+=((string *)local_3a0,(string *)local_98);
        std::__cxx11::string::operator+=((string *)local_3a0,"_FLAG");
        psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_3a0);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)psVar6);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
        std::__cxx11::string::~string((string *)local_3a0);
      }
    }
    AddLanguageFlagsForLinking(this,flags,target,(string *)local_98,(string *)&pcli);
    if (pcli_00 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
    }
    pcVar2 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"BUILD_SHARED_LIBS",
               (allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
    pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_3c8);
    bVar4 = cmSystemTools::IsOn(pcVar8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"CMAKE_SHARED_BUILD_",&local_431);
      std::operator+(&local_410,&local_430,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"_FLAGS",
                 (allocator<char> *)(cmp0065Flags.field_2._M_local_buf + 0xf));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
                     &local_410,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)(cmp0065Flags.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator(&local_431);
      psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_3f0);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)psVar6);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      std::__cxx11::string::~string((string *)local_3f0);
    }
    GetLinkLibsCMP0065((string *)&targetLinkFlags_1,this,(string *)local_98,target);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      std::__cxx11::string::operator+=
                ((string *)buildType.field_2._8_8_,(string *)&targetLinkFlags_1);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,"LINK_FLAGS",
               (allocator<char> *)(configLinkFlags_1.field_2._M_local_buf + 0xf));
    pcVar8 = cmGeneratorTarget::GetProperty(target,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(configLinkFlags_1.field_2._M_local_buf + 0xf));
    local_488 = pcVar8;
    if (pcVar8 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar8);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4d0,"LINK_FLAGS_",
                 (allocator<char> *)
                 ((long)&opts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&opts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::operator+=((string *)local_4d0,(string *)&pcli);
      local_488 = cmGeneratorTarget::GetProperty(target,(string *)local_4d0);
      if (local_488 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,local_488);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      }
      std::__cxx11::string::~string((string *)local_4d0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4f0);
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4f0,config,(string *)local_98);
    AppendCompileOptions
              (this,(string *)buildType.field_2._8_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4f0,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4f0);
    std::__cxx11::string::~string((string *)&targetLinkFlags_1);
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags
              (this,(string *)buildType.field_2._8_8_,(string *)&pcli,(string *)local_98,target);
    break;
  case MODULE_LIBRARY:
    linkLanguage.field_2._8_8_ = anon_var_dwarf_7b4f7;
  case SHARED_LIBRARY:
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"Swift");
    uVar3 = linkLanguage.field_2._8_8_;
    if (bVar4) {
      pcVar2 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(char *)uVar3,
                 (allocator<char> *)(build.field_2._M_local_buf + 0xf));
      psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_b8);
      std::__cxx11::string::operator=((string *)buildType.field_2._8_8_,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)(build.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      uVar9 = std::__cxx11::string::empty();
      uVar3 = linkLanguage.field_2._8_8_;
      if ((uVar9 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e0,(char *)uVar3,&local_e1);
        std::allocator<char>::~allocator(&local_e1);
        std::__cxx11::string::operator+=((string *)local_e0,"_");
        std::__cxx11::string::operator+=((string *)local_e0,(string *)&pcli);
        psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_e0);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)psVar6);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
        std::__cxx11::string::~string((string *)local_e0);
      }
      pcVar2 = this->Makefile;
      std::allocator<char>::allocator();
      local_132 = 0;
      local_133 = 0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"WIN32",&local_109);
      bVar4 = cmMakefile::IsOn(pcVar2,&local_108);
      local_562 = 0;
      if (bVar4) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        local_132 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"CYGWIN",&local_131)
        ;
        local_133 = 1;
        bVar4 = cmMakefile::IsOn(pcVar2,&local_130);
        local_57a = true;
        if (!bVar4) {
          pcVar2 = this->Makefile;
          std::allocator<char>::allocator();
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,"MINGW",
                     (allocator<char> *)
                     ((long)&sources.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          local_57a = cmMakefile::IsOn(pcVar2,&local_158);
        }
        local_562 = local_57a ^ 0xff;
      }
      if ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_158);
      }
      if ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      if ((local_133 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_130);
      }
      if ((local_132 & 1) != 0) {
        std::allocator<char>::~allocator(&local_131);
      }
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      if ((local_562 & 1) != 0) {
        pvVar1 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                 ((long)&defFlag.field_2 + 8);
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(pvVar1);
        cmGeneratorTarget::GetSourceFiles(target,pvVar1,(string *)&pcli);
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"CMAKE_LINK_DEF_FILE_FLAG",
                   (allocator<char> *)((long)&__range4 + 7));
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_1b8);
        std::__cxx11::string::string(local_198,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        pvVar1 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                 ((long)&defFlag.field_2 + 8);
        __end4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(pvVar1);
        sf = (cmSourceFile *)
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(pvVar1);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                           *)&sf), bVar4) {
          ppcVar7 = __gnu_cxx::
                    __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                    ::operator*(&__end4);
          local_1e0 = *ppcVar7;
          psVar6 = cmSourceFile::GetExtension_abi_cxx11_(local_1e0);
          bVar4 = std::operator==(psVar6,"def");
          if (bVar4) {
            std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,local_198);
            psVar6 = cmSourceFile::GetFullPath(local_1e0,(string *)0x0);
            cmsys::SystemTools::CollapseFullPath((string *)&targetLinkFlags,psVar6);
            cmOutputConverter::ConvertToOutputFormat
                      (&local_200,&this->super_cmOutputConverter,(string *)&targetLinkFlags,SHELL);
            std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)&local_200)
            ;
            std::__cxx11::string::~string((string *)&local_200);
            std::__cxx11::string::~string((string *)&targetLinkFlags);
            std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
          }
          __gnu_cxx::
          __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
          ::operator++(&__end4);
        }
        std::__cxx11::string::~string(local_198);
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                  ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                   ((long)&defFlag.field_2 + 8));
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"LINK_FLAGS",
               (allocator<char> *)(configLinkFlags.field_2._M_local_buf + 0xf));
    pcVar8 = cmGeneratorTarget::GetProperty(target,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator
              ((allocator<char> *)(configLinkFlags.field_2._M_local_buf + 0xf));
    local_228 = pcVar8;
    if (pcVar8 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar8);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_270,"LINK_FLAGS_",
                 (allocator<char> *)
                 ((long)&opts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&opts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::operator+=((string *)local_270,(string *)&pcli);
      local_228 = cmGeneratorTarget::GetProperty(target,(string *)local_270);
      if (local_228 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,local_228);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      }
      std::__cxx11::string::~string((string *)local_270);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_290);
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_290,config,(string *)local_98);
    AppendCompileOptions
              (this,(string *)buildType.field_2._8_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_290,(char *)0x0);
    if (pcli_00 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_290);
  }
  AppendPositionIndependentLinkerFlags
            (this,(string *)buildType.field_2._8_8_,target,config,(string *)local_98);
  AppendIPOLinkerFlags(this,(string *)buildType.field_2._8_8_,target,config,(string *)local_98);
  local_304 = 0;
LAB_0018b8ed:
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&pcli);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      if (linkLanguage != "Swift") {
        linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = libraryLinkVariable;
          build += "_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (this->Makefile->IsOn("WIN32") &&
            !(this->Makefile->IsOn("CYGWIN") ||
              this->Makefile->IsOn("MINGW"))) {
          std::vector<cmSourceFile*> sources;
          target->GetSourceFiles(sources, buildType);
          std::string defFlag =
            this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
          for (cmSourceFile* sf : sources) {
            if (sf->GetExtension() == "def") {
              linkFlags += defFlag;
              linkFlags += this->ConvertToOutputFormat(
                cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
              linkFlags += " ";
            }
          }
        }
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      if (linkLanguage != "Swift") {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = "CMAKE_EXE_LINKER_FLAGS_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
          linkFlags += " ";
        } else {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
          linkFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
          exportFlagVar += linkLanguage;
          exportFlagVar += "_FLAG";

          linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
          linkFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
    } break;
    default:
      break;
  }

  this->AppendPositionIndependentLinkerFlags(linkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}